

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O2

int __thiscall amrex::BndryRegister::init(BndryRegister *this,EVP_PKEY_CTX *ctx)

{
  uint ncomp;
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Array4<double> dfab;
  Array4<const_double> sfab;
  FabSetIter mfi;
  long local_1a8;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  BoxArray::operator=(&this->grids,(BoxArray *)(ctx + 0x908));
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    lVar6 = lVar1 * 0x180;
    ncomp = *(uint *)(ctx + lVar6 + 0xd4);
    FabSet::define(this->bndry + lVar1,(BoxArray *)(ctx + lVar6 + 0x10),
                   (DistributionMapping *)(ctx + 0x78),ncomp);
    FabSetIter::FabSetIter((FabSetIter *)&local_90,(FabSet *)(ctx + lVar6 + 8));
    if ((int)ncomp < 1) {
      ncomp = 0;
    }
    while (local_90.currentIndex < local_90.endIndex) {
      MFIter::validbox(&local_12c,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,(FabArray<amrex::FArrayBox> *)(ctx + lVar6 + 8),&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,(FabArray<amrex::FArrayBox> *)(this->bndry + lVar1),&local_90);
      lVar2 = (long)local_12c.smallend.vect[1];
      local_1a8 = 0;
      uVar3 = 0;
      while( true ) {
        lVar4 = (long)local_12c.smallend.vect[2];
        if (uVar3 == ncomp) break;
        for (; (int)lVar4 <= local_12c.bigend.vect[2]; lVar4 = lVar4 + 1) {
          lVar9 = (long)local_d0.p +
                  local_d0.nstride * local_1a8 +
                  (lVar2 - local_d0.begin.y) * local_d0.jstride * 8 +
                  (lVar4 - local_d0.begin.z) * local_d0.kstride * 8 + (long)local_d0.begin.x * -8 +
                  (long)local_12c.smallend.vect[0] * 8;
          lVar7 = (long)local_110.p +
                  local_110.nstride * local_1a8 +
                  (lVar2 - local_110.begin.y) * local_110.jstride * 8 +
                  (lVar4 - local_110.begin.z) * local_110.kstride * 8 + (long)local_110.begin.x * -8
                  + (long)local_12c.smallend.vect[0] * 8;
          for (lVar5 = lVar2; lVar5 <= local_12c.bigend.vect[1]; lVar5 = lVar5 + 1) {
            if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
              lVar8 = 0;
              do {
                *(undefined8 *)(lVar7 + lVar8 * 8) = *(undefined8 *)(lVar9 + lVar8 * 8);
                lVar8 = lVar8 + 1;
              } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar8);
            }
            lVar9 = lVar9 + local_d0.jstride * 8;
            lVar7 = lVar7 + local_110.jstride * 8;
          }
        }
        uVar3 = uVar3 + 1;
        local_1a8 = local_1a8 + 8;
      }
      MFIter::operator++(&local_90);
    }
    MFIter::~MFIter(&local_90);
  }
  return 6;
}

Assistant:

void
BndryRegister::init (const BndryRegister& src)
{
    grids = src.grids;

    for (int idim = 0; idim < 2*AMREX_SPACEDIM; idim++)
    {
        const int ncomp = src.bndry[idim].nComp();
        bndry[idim].define(src.bndry[idim].boxArray(), src.DistributionMap(), ncomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (FabSetIter mfi(src.bndry[idim]); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.validbox();
            auto const sfab = src.bndry[idim].array(mfi);
            auto       dfab =     bndry[idim].array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                dfab(i,j,k,n) = sfab(i,j,k,n);
            });
        }
    }
}